

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

X509_EXTENSION * X509V3_EXT_nconf_nid(CONF *conf,X509V3_CTX *ctx,int ext_nid,char *value)

{
  int crit_00;
  int gen_type;
  char *ext;
  int ext_type;
  int crit;
  X509V3_CTX ctx_tmp;
  char *value_local;
  X509V3_CTX *pXStack_20;
  int ext_nid_local;
  X509V3_CTX *ctx_local;
  CONF *conf_local;
  
  ctx_tmp.db = (CONF *)value;
  pXStack_20 = ctx;
  if (ctx == (X509V3_CTX *)0x0) {
    X509V3_set_ctx((X509V3_CTX *)&ext_type,(X509 *)0x0,(X509 *)0x0,(X509_REQ *)0x0,(X509_CRL *)0x0,0
                  );
    X509V3_set_nconf((X509V3_CTX *)&ext_type,conf);
    pXStack_20 = (X509V3_CTX *)&ext_type;
  }
  crit_00 = v3_check_critical((char **)&ctx_tmp.db);
  gen_type = v3_check_generic((char **)&ctx_tmp.db);
  if (gen_type == 0) {
    conf_local = (CONF *)do_ext_nconf((CONF *)conf,(X509V3_CTX *)pXStack_20,ext_nid,crit_00,
                                      (char *)ctx_tmp.db);
  }
  else {
    ext = OBJ_nid2sn(ext_nid);
    conf_local = (CONF *)v3_generic_extension
                                   (ext,(char *)ctx_tmp.db,crit_00,gen_type,(X509V3_CTX *)pXStack_20
                                   );
  }
  return (X509_EXTENSION *)conf_local;
}

Assistant:

X509_EXTENSION *X509V3_EXT_nconf_nid(const CONF *conf, const X509V3_CTX *ctx,
                                     int ext_nid, const char *value) {
  // If omitted, fill in an empty |X509V3_CTX|.
  X509V3_CTX ctx_tmp;
  if (ctx == NULL) {
    X509V3_set_ctx(&ctx_tmp, NULL, NULL, NULL, NULL, 0);
    X509V3_set_nconf(&ctx_tmp, conf);
    ctx = &ctx_tmp;
  }

  int crit = v3_check_critical(&value);
  int ext_type = v3_check_generic(&value);
  if (ext_type != 0) {
    return v3_generic_extension(OBJ_nid2sn(ext_nid), value, crit, ext_type,
                                ctx);
  }
  return do_ext_nconf(conf, ctx, ext_nid, crit, value);
}